

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O1

int32_t get_algorithm<short>(short d)

{
  short sVar1;
  int32_t iVar3;
  byte bVar4;
  uint uVar5;
  short sVar6;
  int iVar7;
  ushort uVar8;
  short *in_RSI;
  undefined6 in_register_0000003a;
  long *plVar9;
  long lVar10;
  bool bVar11;
  uint uVar2;
  
  plVar9 = (long *)CONCAT62(in_register_0000003a,d);
  if (d != 0) {
    uVar8 = -d;
    if (0 < d) {
      uVar8 = d;
    }
    uVar5 = (ushort)LZCOUNT(uVar8) ^ 0xf;
    bVar4 = 0;
    if ((uVar8 - 1 & uVar8) == 0) {
      bVar11 = true;
    }
    else {
      uVar2 = (uint)(0x8000 << uVar5) / (uint)uVar8;
      sVar1 = (short)uVar2;
      iVar7 = uVar2 * uVar8;
      if (((uint)uVar8 + iVar7 & 0xffff) >> uVar5 == 0) {
        bVar4 = 0xe - (char)LZCOUNT(uVar8);
      }
      else {
        sVar6 = (short)iVar7;
        sVar1 = (ushort)(0 < sVar6 || uVar8 <= (ushort)(sVar6 * -2)) + sVar1 * 2;
        bVar4 = 0x40;
      }
      sVar6 = -2 - sVar1;
      if (d < 0) {
        sVar6 = sVar1;
      }
      bVar11 = sVar6 == -1;
    }
    iVar3 = 0;
    if (!bVar11) {
      iVar3 = 2 - (uint)((bVar4 & 0x40) == 0);
    }
    return iVar3;
  }
  get_algorithm<short>();
  if ((ulong)*(uint *)(plVar9 + 1) != 0) {
    lVar10 = 0;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + (int)*(short *)(*plVar9 + lVar10) / (int)*in_RSI;
      lVar10 = lVar10 + 2;
    } while ((ulong)*(uint *)(plVar9 + 1) * 2 != lVar10);
    return uVar5 & 0xffff;
  }
  return 0;
}

Assistant:

static LIBDIVIDE_INLINE struct libdivide_s16_t libdivide_internal_s16_gen(
    int16_t d, int branchfree) {
    if (d == 0) {
        LIBDIVIDE_ERROR("divider must be != 0");
    }

    struct libdivide_s16_t result;

    // If d is a power of 2, or negative a power of 2, we have to use a shift.
    // This is especially important because the magic algorithm fails for -1.
    // To check if d is a power of 2 or its inverse, it suffices to check
    // whether its absolute value has exactly one bit set. This works even for
    // INT_MIN, because abs(INT_MIN) == INT_MIN, and INT_MIN has one bit set
    // and is a power of 2.
    uint16_t ud = (uint16_t)d;
    uint16_t absD = (d < 0) ? -ud : ud;
    uint16_t floor_log_2_d = 15 - libdivide_count_leading_zeros16(absD);
    // check if exactly one bit is set,
    // don't care if absD is 0 since that's divide by zero
    if ((absD & (absD - 1)) == 0) {
        // Branchfree and normal paths are exactly the same
        result.magic = 0;
        result.more = (uint8_t)(floor_log_2_d | (d < 0 ? LIBDIVIDE_NEGATIVE_DIVISOR : 0));
    } else {
        LIBDIVIDE_ASSERT(floor_log_2_d >= 1);

        uint8_t more;
        // the dividend here is 2**(floor_log_2_d + 31), so the low 16 bit word
        // is 0 and the high word is floor_log_2_d - 1
        uint16_t rem, proposed_m;
        proposed_m = libdivide_32_div_16_to_16((uint16_t)1 << (floor_log_2_d - 1), 0, absD, &rem);
        const uint16_t e = absD - rem;

        // We are going to start with a power of floor_log_2_d - 1.
        // This works if works if e < 2**floor_log_2_d.
        if (!branchfree && e < ((uint16_t)1 << floor_log_2_d)) {
            // This power works
            more = (uint8_t)(floor_log_2_d - 1);
        } else {
            // We need to go one higher. This should not make proposed_m
            // overflow, but it will make it negative when interpreted as an
            // int16_t.
            proposed_m += proposed_m;
            const uint16_t twice_rem = rem + rem;
            if (twice_rem >= absD || twice_rem < rem) proposed_m += 1;
            more = (uint8_t)(floor_log_2_d | LIBDIVIDE_ADD_MARKER);
        }

        proposed_m += 1;
        int16_t magic = (int16_t)proposed_m;

        // Mark if we are negative. Note we only negate the magic number in the
        // branchfull case.
        if (d < 0) {
            more |= LIBDIVIDE_NEGATIVE_DIVISOR;
            if (!branchfree) {
                magic = -magic;
            }
        }

        result.more = more;
        result.magic = magic;
    }
    return result;
}